

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleParamNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  int iVar1;
  Property *pPVar2;
  Value *this_00;
  char *pcVar3;
  long lVar4;
  allocator<char> local_3d;
  float local_3c;
  string local_38;
  
  if (node != (DDLNode *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"attrib",&local_3d);
    pPVar2 = ODDLParser::DDLNode::findPropertyByName(node,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (((pPVar2 != (Property *)0x0) && (pPVar2->m_value != (Value *)0x0)) &&
       (this_00 = ODDLParser::DDLNode::getValue(node), this_00 != (Value *)0x0)) {
      local_3c = ODDLParser::Value::getFloat(this_00);
      pcVar3 = ODDLParser::Value::getString(pPVar2->m_value);
      iVar1 = ASSIMP_strincmp("fov",pcVar3,3);
      if (iVar1 == 0) {
        lVar4 = 0x428;
      }
      else {
        pcVar3 = ODDLParser::Value::getString(pPVar2->m_value);
        iVar1 = ASSIMP_strincmp("near",pcVar3,4);
        if (iVar1 == 0) {
          lVar4 = 0x42c;
        }
        else {
          pcVar3 = ODDLParser::Value::getString(pPVar2->m_value);
          iVar1 = ASSIMP_strincmp("far",pcVar3,3);
          if (iVar1 != 0) {
            return;
          }
          lVar4 = 0x430;
        }
      }
      *(float *)((this->m_currentCamera->mName).data + lVar4 + -4) = local_3c;
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleParamNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if ( nullptr == node ) {
        return;
    }

    Property *prop = node->findPropertyByName( "attrib" );
    if ( nullptr == prop ) {
        return;
    }

    if ( nullptr != prop->m_value ) {
        Value *val( node->getValue() );
        if ( nullptr == val ) {
            return;
        }
        const float floatVal( val->getFloat() );
        if ( 0 == ASSIMP_strincmp( "fov", prop->m_value->getString(), 3 ) ) {
            m_currentCamera->mHorizontalFOV = floatVal;
        } else if ( 0 == ASSIMP_strincmp( "near", prop->m_value->getString(), 4 ) ) {
            m_currentCamera->mClipPlaneNear = floatVal;
        } else if ( 0 == ASSIMP_strincmp( "far", prop->m_value->getString(), 3 ) ) {
            m_currentCamera->mClipPlaneFar = floatVal;
        }
    }
}